

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>
               (GetterYs<unsigned_int> *getter1,GetterYRef *getter2,TransformerLogLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  uint uVar7;
  ImPlotPlot *pIVar8;
  double dVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterYRef *local_50;
  TransformerLogLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  pIVar11 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>>
              ((LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar14 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar14 = getter1->Count;
    }
    if (0 < iVar14) {
      iVar15 = 0;
      dVar18 = 0.0;
      do {
        pIVar12 = GImPlot;
        iVar6 = getter1->Count;
        uVar7 = *(uint *)((long)getter1->Ys +
                         (long)(((getter1->Offset + iVar15) % iVar6 + iVar6) % iVar6) *
                         (long)getter1->Stride);
        dVar9 = log10((getter1->XScale * dVar18 + getter1->X0) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar8 = pIVar12->CurrentPlot;
        dVar2 = pIVar12->LogDenX;
        dVar3 = (pIVar8->XAxis).Range.Min;
        dVar4 = (pIVar8->XAxis).Range.Max;
        dVar10 = log10((double)uVar7 / pIVar8->YAxis[transformer->YAxis].Range.Min);
        pIVar13 = GImPlot;
        iVar6 = transformer->YAxis;
        pIVar8 = pIVar12->CurrentPlot;
        auVar19._8_8_ = dVar10;
        auVar19._0_8_ = dVar9;
        auVar22._8_8_ = pIVar12->LogDenY[iVar6];
        auVar22._0_8_ = dVar2;
        auVar19 = divpd(auVar19,auVar22);
        dVar2 = pIVar8->YAxis[iVar6].Range.Min;
        IVar5 = pIVar12->PixelRange[iVar6].Min;
        local_58._4_4_ =
             (float)(pIVar12->My[iVar6] *
                     (((double)(float)auVar19._8_8_ * (pIVar8->YAxis[iVar6].Range.Max - dVar2) +
                      dVar2) - dVar2) + (double)IVar5.y);
        local_58._0_4_ =
             (float)(pIVar12->Mx *
                     (((double)(float)auVar19._0_8_ * (dVar4 - dVar3) + dVar3) -
                     (pIVar8->XAxis).Range.Min) + (double)IVar5.x);
        dVar2 = getter2->YRef;
        dVar10 = log10((getter2->XScale * dVar18 + getter2->X0) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar8 = pIVar13->CurrentPlot;
        dVar3 = pIVar13->LogDenX;
        dVar4 = (pIVar8->XAxis).Range.Min;
        dVar9 = (pIVar8->XAxis).Range.Max;
        dVar2 = log10(dVar2 / pIVar8->YAxis[transformer->YAxis].Range.Min);
        iVar6 = transformer->YAxis;
        pIVar8 = pIVar13->CurrentPlot;
        auVar20._8_8_ = dVar2;
        auVar20._0_8_ = dVar10;
        auVar23._8_8_ = pIVar13->LogDenY[iVar6];
        auVar23._0_8_ = dVar3;
        auVar19 = divpd(auVar20,auVar23);
        dVar2 = pIVar8->YAxis[iVar6].Range.Min;
        IVar5 = pIVar13->PixelRange[iVar6].Min;
        fVar16 = (float)(pIVar13->Mx *
                         (((double)(float)auVar19._0_8_ * (dVar9 - dVar4) + dVar4) -
                         (pIVar8->XAxis).Range.Min) + (double)IVar5.x);
        fVar17 = (float)(pIVar13->My[iVar6] *
                         (((double)(float)auVar19._8_8_ * (pIVar8->YAxis[iVar6].Range.Max - dVar2) +
                          dVar2) - dVar2) + (double)IVar5.y);
        local_60.y = fVar17;
        local_60.x = fVar16;
        pIVar8 = pIVar11->CurrentPlot;
        fVar21 = (float)local_58._4_4_;
        if (fVar17 <= (float)local_58._4_4_) {
          fVar21 = fVar17;
        }
        if ((fVar21 < (pIVar8->PlotRect).Max.y) &&
           (fVar21 = (float)(~-(uint)(fVar17 <= (float)local_58._4_4_) & (uint)fVar17 |
                            local_58._4_4_ & -(uint)(fVar17 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar8->PlotRect).Min.y, *pfVar1 <= fVar21 && fVar21 != *pfVar1)) {
          fVar21 = (float)local_58._0_4_;
          if (fVar16 <= (float)local_58._0_4_) {
            fVar21 = fVar16;
          }
          if ((fVar21 < (pIVar8->PlotRect).Max.x) &&
             (fVar21 = (float)(-(uint)(fVar16 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar16 <= (float)local_58._0_4_) & (uint)fVar16),
             (pIVar8->PlotRect).Min.x <= fVar21 && fVar21 != (pIVar8->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        dVar18 = dVar18 + 1.0;
        iVar15 = iVar15 + 1;
      } while (iVar14 != iVar15);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}